

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O2

void __thiscall ParserTestDyndepOrderOnlyInput::Run(ParserTestDyndepOrderOnlyInput *this)

{
  int iVar1;
  Edge *pEVar2;
  Test *this_00;
  bool bVar3;
  Node *pNVar4;
  StringPiece path;
  
  iVar1 = g_current_test->assertion_failures_;
  ParserTest::AssertParse
            (&this->super_ParserTest,
             "rule cat\n  command = cat $in > $out\nbuild result: cat in || dd\n  dyndep = dd\n");
  if (iVar1 == g_current_test->assertion_failures_) {
    path.len_ = 6;
    path.str_ = "result";
    pNVar4 = State::GetNode(&(this->super_ParserTest).state,path,0);
    pEVar2 = pNVar4->in_edge_;
    bVar3 = testing::Test::Check
                      (g_current_test,pEVar2->dyndep_ != (Node *)0x0,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/manifest_parser_test.cc"
                       ,0x480,"edge->dyndep_");
    if (bVar3) {
      testing::Test::Check
                (g_current_test,pEVar2->dyndep_->dyndep_pending_,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/manifest_parser_test.cc"
                 ,0x481,"edge->dyndep_->dyndep_pending()");
      this_00 = g_current_test;
      bVar3 = std::operator==(&pEVar2->dyndep_->path_,"dd");
      testing::Test::Check
                (this_00,bVar3,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/manifest_parser_test.cc"
                 ,0x482,"edge->dyndep_->path() == \"dd\"");
      return;
    }
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(ParserTest, DyndepOrderOnlyInput) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"rule cat\n"
"  command = cat $in > $out\n"
"build result: cat in || dd\n"
"  dyndep = dd\n"));
  Edge* edge = state.GetNode("result", 0)->in_edge();
  ASSERT_TRUE(edge->dyndep_);
  EXPECT_TRUE(edge->dyndep_->dyndep_pending());
  EXPECT_EQ(edge->dyndep_->path(), "dd");
}